

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,
          Maybe<capnp::Schema> *typeScope)

{
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> **ppRVar1;
  bool bVar2;
  UnfinishedValue *pUVar3;
  UnfinishedValue *pUVar4;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar5;
  Reader type_00;
  ushort uVar6;
  long lVar7;
  size_t newSize;
  SegmentReader **ppSVar8;
  Schema typeScope_00;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar9;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar10;
  byte bVar11;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  StructDataBitCount local_68;
  StructPointerCount SStack_64;
  undefined2 uStack_62;
  int iStack_60;
  undefined4 uStack_5c;
  SegmentReader *local_58;
  CapTableReader *pCStack_50;
  void *local_48;
  WirePointer *pWStack_40;
  undefined8 local_38;
  int iStack_30;
  undefined4 uStack_2c;
  
  bVar11 = 0;
  aVar10 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)&type;
  compileDefaultDefaultValue(this,type,target);
  if (type._reader.dataSize < 0x10) {
    uVar6 = 0;
  }
  else {
    uVar6 = *type._reader.data;
  }
  if ((uVar6 < 0x13) && ((0x74000U >> (uVar6 & 0x1f) & 1) != 0)) {
    local_68 = source._reader.dataSize;
    SStack_64 = source._reader.pointerCount;
    uStack_62 = source._reader._38_2_;
    iStack_60 = source._reader.nestingLimit;
    uStack_5c = source._reader._44_4_;
    local_78 = source._reader.data;
    pWStack_70 = source._reader.pointers;
    local_88 = source._reader.segment;
    pCStack_80 = source._reader.capTable;
    local_38 = CONCAT44(type._reader._36_4_,type._reader.dataSize);
    iStack_30 = type._reader.nestingLimit;
    uStack_2c = type._reader._44_4_;
    local_48 = type._reader.data;
    pWStack_40 = type._reader.pointers;
    local_58 = type._reader.segment;
    pCStack_50 = type._reader.capTable;
    bVar2 = (typeScope->ptr).isSet;
    if (bVar2 == true) {
      aVar10 = (typeScope->ptr).field_1;
    }
    pUVar3 = (this->unfinishedValues).builder.endPtr;
    if ((this->unfinishedValues).builder.pos == pUVar3) {
      pUVar4 = (this->unfinishedValues).builder.ptr;
      newSize = 4;
      if (pUVar3 != pUVar4) {
        newSize = ((long)pUVar3 - (long)pUVar4 >> 3) * 0xd79435e50d79436;
      }
      kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
                (&this->unfinishedValues,newSize);
    }
    pRVar5 = (this->unfinishedValues).builder.pos;
    ppSVar8 = &local_88;
    pRVar9 = pRVar5;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pRVar9->source)._reader.segment = *ppSVar8;
      ppSVar8 = ppSVar8 + (ulong)bVar11 * -2 + 1;
      pRVar9 = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
               ((long)pRVar9 + (ulong)bVar11 * -0x10 + 8);
    }
    (pRVar5->typeScope).ptr.isSet = bVar2;
    if (bVar2 != false) {
      (pRVar5->typeScope).ptr.field_1 = aVar10;
    }
    (pRVar5->target)._builder.dataSize = target._builder.dataSize;
    (pRVar5->target)._builder.pointerCount = target._builder.pointerCount;
    *(undefined2 *)&(pRVar5->target)._builder.field_0x26 = target._builder._38_2_;
    (pRVar5->target)._builder.data = target._builder.data;
    (pRVar5->target)._builder.pointers = target._builder.pointers;
    (pRVar5->target)._builder.segment = target._builder.segment;
    (pRVar5->target)._builder.capTable = target._builder.capTable;
    ppRVar1 = &(this->unfinishedValues).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    return;
  }
  if ((typeScope->ptr).isSet == true) {
    typeScope_00.raw = (typeScope->ptr).field_1.value.raw;
  }
  else {
    typeScope_00.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  }
  type_00._reader.capTable = type._reader.capTable;
  type_00._reader.segment = type._reader.segment;
  type_00._reader.data = type._reader.data;
  type_00._reader.pointers = type._reader.pointers;
  type_00._reader.dataSize = type._reader.dataSize;
  type_00._reader.pointerCount = type._reader.pointerCount;
  type_00._reader._38_2_ = type._reader._38_2_;
  type_00._reader.nestingLimit = type._reader.nestingLimit;
  type_00._reader._44_4_ = type._reader._44_4_;
  compileValue(this,source,type_00,typeScope_00,target,true);
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    kj::Maybe<Schema> typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value. (Note that the scope can't possibly matter since primitives are not
      // generic.)
      compileValue(source, type, typeScope.orDefault(Schema()), target, true);
      break;
  }
}